

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O0

IDenseNetwork * __thiscall
IDenseNetwork::Backward(IDenseNetwork *this,vector<float,_std::allocator<float>_> *deltas)

{
  ILayer *pIVar1;
  bool bVar2;
  reference ppIVar3;
  reference ppIVar4;
  vector<float,_std::allocator<float>_> local_48;
  undefined1 local_30 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>_>
  local_20;
  reverse_iterator<__gnu_cxx::__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>_>
  it;
  vector<float,_std::allocator<float>_> *deltas_local;
  IDenseNetwork *this_local;
  
  it.current._M_current =
       (__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>)
       (__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>)deltas;
  ppIVar3 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::back(&this->layers);
  (*(*ppIVar3)->_vptr_ILayer[9])(*ppIVar3,it.current._M_current);
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::rbegin
            ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)(local_30 + 8));
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>_>
  ::operator+(&local_20,(difference_type)(local_30 + 8));
  while( true ) {
    std::vector<ILayer_*,_std::allocator<ILayer_*>_>::rend
              ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)local_30);
    bVar2 = std::operator!=(&local_20,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>_>
                             *)local_30);
    if (!bVar2) break;
    ppIVar4 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>_>
              ::operator*(&local_20);
    pIVar1 = *ppIVar4;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::vector(&local_48);
    (*pIVar1->_vptr_ILayer[9])(pIVar1,&local_48);
    std::vector<float,_std::allocator<float>_>::~vector(&local_48);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>_>
    ::operator++(&local_20);
  }
  return this;
}

Assistant:

IDenseNetwork &IDenseNetwork::Backward( const std::vector<float> &deltas )
{
    layers.back()->Backward( deltas );
    for ( auto it = layers.rbegin() + 1; it != layers.rend(); ++it ) {
        ( *it )->Backward( {} );
    }
    return *this;
}